

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O0

void class5(int *ip)

{
  int iVar1;
  uint uVar2;
  int mode;
  uint addr;
  int zp;
  int *ip_local;
  
  loccnt = loccnt + 3;
  iVar1 = getoperand(ip,4,0x2c);
  uVar2 = value;
  if (((iVar1 != 0) && (iVar1 = getoperand(ip,0x100,0x3b), iVar1 != 0)) && (pass == 1)) {
    putbyte(data_loccnt,opval);
    putbyte(data_loccnt + 1,uVar2);
    uVar2 = value - (loccnt + page * 0x2000);
    if ((uVar2 < 0x80) || (0xffffff7f < uVar2)) {
      putbyte(data_loccnt + 2,uVar2);
      println();
    }
    else {
      error("Branch address out of range!");
    }
  }
  return;
}

Assistant:

void
class5(int *ip)
{
	int	zp;
	unsigned int addr;
	int mode;

	/* update location counter */
	loccnt += 3;

	/* get first operand */
	mode = getoperand(ip, ZP, ',');
	zp   = value;
	if (!mode)
		return;

	/* get second operand */
	mode = getoperand(ip, ABS, ';');
	if (!mode)
		return;

	/* generate code */
	if (pass == LAST_PASS) {
		/* opcodes */
		putbyte(data_loccnt, opval);
		putbyte(data_loccnt+1, zp);

		/* calculate branch offset */
		addr = value - (loccnt + (page << 13));

		/* check range */
		if (addr > 0x7F && addr < 0xFFFFFF80) {
			error("Branch address out of range!");
			return;
		}

		/* offset */
		putbyte(data_loccnt+2, addr);

		/* output line */
		println();
	}
}